

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_196f0::IDLExportVisitor::visit_(IDLExportVisitor *this,Container *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Typelib::Type_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
  *this_00;
  size_type sVar4;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder;
  iterator_range<const_char_*> FormatResult;
  int iVar5;
  Type *pTVar6;
  ostream *poVar7;
  long *plVar8;
  input_iterator_type OuterIt;
  _Alloc_hider _Var9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  ulong *puVar11;
  size_type sVar12;
  size_type sVar13;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  bool bVar15;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult;
  string element_name;
  string typedef_name;
  string target_namespace;
  string local_110;
  string local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  Typelib::Type::getName_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)&local_d0);
  paVar2 = &local_d0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.first._M_dataplus._M_p);
  }
  if (iVar5 != 0) {
    pTVar6 = (Type *)Typelib::Indirect::getIndirection();
    paVar3 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    getIDLBase(&local_d0,pTVar6,this->m_exporter,&local_f0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.first._M_dataplus._M_p == paVar2) {
      local_70.field_2._8_8_ = local_d0.first.field_2._8_8_;
    }
    else {
      local_70._M_dataplus._M_p = local_d0.first._M_dataplus._M_p;
    }
    paVar1 = &local_d0.second.field_2;
    local_70._M_string_length = local_d0.first._M_string_length;
    local_d0.first._M_string_length = 0;
    local_d0.first.field_2._M_allocated_capacity =
         local_d0.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_d0.first._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_70._M_string_length == 0) {
      local_f0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
      getIDLAbsoluteNamespace(&local_d0.first,&local_f0,this->m_exporter);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    setTargetNamespace(this,&local_70);
    pTVar6 = (Type *)Typelib::Indirect::getIndirection();
    local_d0.first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    getIDLAbsolute(&local_f0,pTVar6,this->m_exporter,&local_d0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.first._M_dataplus._M_p);
    }
    paVar3 = &local_110.field_2;
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    getIDLBase(&local_d0,(Type *)type,this->m_exporter,&local_110);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.second._M_dataplus._M_p == paVar1) {
      local_90.field_2._8_8_ = local_d0.second.field_2._8_8_;
    }
    else {
      local_90._M_dataplus._M_p = local_d0.second._M_dataplus._M_p;
    }
    local_90._M_string_length = local_d0.second._M_string_length;
    local_d0.second._M_string_length = 0;
    local_d0.second.field_2._M_local_buf[0] = '\0';
    local_d0.second._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    local_d0.first._M_dataplus._M_p = "::";
    local_d0.first._M_string_length = 0x11821d;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_90._M_dataplus._M_p + local_90._M_string_length);
    _Var9._M_p = local_90._M_dataplus._M_p;
    _Var10._M_current = (char *)paVar1;
    _Var14._M_current = (char *)paVar1;
    sVar4 = local_90._M_string_length;
    if (local_90._M_string_length != 0) {
      do {
        sVar12 = 0;
        do {
          sVar13 = sVar12;
          if ((_Var9._M_p[sVar12] != "::"[sVar12]) || (sVar13 = sVar12 + 1, sVar4 - 1 == sVar12))
          break;
          bVar15 = sVar12 != 1;
          sVar12 = sVar13;
        } while (bVar15);
        _Var10._M_current = _Var9._M_p;
        _Var14._M_current = (char *)(_Var9._M_p + sVar13);
      } while ((sVar13 != 2) &&
              (_Var9._M_p = _Var9._M_p + 1, _Var10._M_current = (char *)paVar1,
              _Var14._M_current = (char *)paVar1, sVar4 = sVar4 - 1,
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != paVar1));
    }
    if (_Var10._M_current != _Var14._M_current) {
      local_110._M_dataplus._M_p = "_";
      local_110._M_string_length = 0x11821a;
      Finder.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Finder.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "::";
      Finder._16_8_ = local_d0.first.field_2._M_allocated_capacity;
      FormatResult.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      FormatResult.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "_";
      Formatter.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Formatter.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "_";
      FindResult.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_current = _Var14._M_current;
      FindResult.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_current = _Var10._M_current;
      boost::algorithm::detail::
      find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                (&local_90,Finder,Formatter,FindResult,FormatResult);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->m_stream,(this->m_indent)._M_dataplus._M_p,
                        (this->m_indent)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"typedef sequence<",0x11);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"> ",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Typelib::Type_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
               *)this->m_exported_typedefs;
    Typelib::Indirect::getIndirection();
    Typelib::Type::getNamespace_abi_cxx11_();
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)local_90._M_dataplus._M_p);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_110.field_2._M_allocated_capacity = *puVar11;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar11;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0.first._M_string_length = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar3) {
      local_d0.first.field_2._8_8_ = local_110.field_2._8_8_;
      local_d0.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d0.first._M_dataplus._M_p = local_110._M_dataplus._M_p;
    }
    local_d0.first.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
    local_110._M_string_length = 0;
    local_110.field_2._M_allocated_capacity =
         local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_110._M_dataplus._M_p = (pointer)paVar3;
    local_d0.second._M_dataplus._M_p = (pointer)type;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Typelib::Type_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Typelib::Container_const*>>
              (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Container_*>
                        *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Container const& type)
    {
        if (type.getName() == "/std/string")
            return true;

        // sequence<> can be used as-is, but in order to be as cross-ORB
        // compatible as possible we generate sequence typedefs and use them in
        // the compounds. Emit the sequence right now.
        string target_namespace  = getIDLBase(type.getIndirection()).first;
        // We never emit sequences into the main namespace, even if their
        // element is a builtin
        if (target_namespace.empty())
            target_namespace = getIDLAbsoluteNamespace("/", m_exporter);
        setTargetNamespace(target_namespace);

        std::string element_name = getIDLAbsolute(type.getIndirection());
        std::string typedef_name = getIDLBase(type).second;
        boost::replace_all(typedef_name, "::", "_");
        m_stream << m_indent << "typedef sequence<" << element_name << "> " << typedef_name << ";\n";
        m_exported_typedefs.insert(make_pair(type.getIndirection().getNamespace() + typedef_name, &type));

        return true;
    }